

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_4.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  
  lVar1 = std::cin;
  *(uint *)(std::__cxx11::string::_M_replace_aux + *(long *)(std::cin + -0x18)) =
       *(uint *)(std::__cxx11::string::_M_replace_aux + *(long *)(std::cin + -0x18)) & 0xfffffffd;
  *(uint *)(std::__cxx11::string::_M_replace_aux + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::_M_replace_aux + *(long *)(lVar1 + -0x18)) & 0xfffffff7;
  *(uint *)(std::__cxx11::string::_M_replace_aux + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::_M_replace_aux + *(long *)(lVar1 + -0x18)) & 0xffffffbf;
  read_numbers();
  return 0;
}

Assistant:

void unset_stream(std::istream& is)
{
	is.unsetf(std::ios::dec);
	is.unsetf(std::ios::hex);
	is.unsetf(std::ios::oct);
}